

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_string_parser.cpp
# Opt level: O0

string * __thiscall
ICM::to_string_abi_cxx11_(string *__return_storage_ptr__,ICM *this,MatchResult *mr)

{
  MatchType MVar1;
  MatchType type;
  string local_70;
  string local_50;
  undefined1 local_19;
  MatchResult *local_18;
  MatchResult *mr_local;
  string *str;
  
  local_19 = 0;
  local_18 = (MatchResult *)this;
  mr_local = (MatchResult *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  MVar1 = Parser::MatchResult::getType(local_18);
  to_string_abi_cxx11_(&local_50,(ICM *)(ulong)MVar1,type);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  Parser::MatchResult::getString_abi_cxx11_(&local_70,local_18);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string to_string(const Parser::MatchResult &mr) {
		// Main
		string str;
		str.append("(");
		str.append(ICM::to_string(mr.getType()));
		str.append(", \'");
		str.append(mr.getString());
		str.append("')");
		return str;
	}